

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadPool.cpp
# Opt level: O3

bool __thiscall hwnet::ThreadPool::TaskQueue::Get(TaskQueue *this,taskque *out)

{
  mutex *__mutex;
  _Map_pointer ppsVar1;
  _Map_pointer ppsVar2;
  _Map_pointer ppsVar3;
  size_t sVar4;
  _Elt_pointer psVar5;
  _Elt_pointer psVar6;
  _Elt_pointer psVar7;
  _Elt_pointer psVar8;
  int iVar9;
  _Elt_pointer psVar10;
  long lVar11;
  _Elt_pointer psVar12;
  taskque *ptVar13;
  taskque *ptVar14;
  bool bVar15;
  byte bVar16;
  
  bVar16 = 0;
  __mutex = &this->mtx;
  iVar9 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
  if (iVar9 != 0) {
    std::__throw_system_error(iVar9);
  }
  if (this->closed == false) {
    do {
      psVar12 = (this->tasks).
                super__Deque_base<std::shared_ptr<hwnet::Task>,_std::allocator<std::shared_ptr<hwnet::Task>_>_>
                ._M_impl.super__Deque_impl_data._M_start._M_cur;
      psVar10 = (this->tasks).
                super__Deque_base<std::shared_ptr<hwnet::Task>,_std::allocator<std::shared_ptr<hwnet::Task>_>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_cur;
      if (psVar10 != psVar12) goto LAB_001182a8;
      this->watting = this->watting + 1;
      std::_V2::condition_variable_any::wait<std::mutex>(&this->cv,__mutex);
      this->watting = this->watting + -1;
    } while (this->closed == false);
  }
  psVar12 = (this->tasks).
            super__Deque_base<std::shared_ptr<hwnet::Task>,_std::allocator<std::shared_ptr<hwnet::Task>_>_>
            ._M_impl.super__Deque_impl_data._M_start._M_cur;
  psVar10 = (this->tasks).
            super__Deque_base<std::shared_ptr<hwnet::Task>,_std::allocator<std::shared_ptr<hwnet::Task>_>_>
            ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (psVar10 == psVar12) {
    bVar15 = false;
  }
  else {
LAB_001182a8:
    ppsVar3 = (this->tasks).
              super__Deque_base<std::shared_ptr<hwnet::Task>,_std::allocator<std::shared_ptr<hwnet::Task>_>_>
              ._M_impl.super__Deque_impl_data._M_map;
    sVar4 = (this->tasks).
            super__Deque_base<std::shared_ptr<hwnet::Task>,_std::allocator<std::shared_ptr<hwnet::Task>_>_>
            ._M_impl.super__Deque_impl_data._M_map_size;
    psVar5 = (this->tasks).
             super__Deque_base<std::shared_ptr<hwnet::Task>,_std::allocator<std::shared_ptr<hwnet::Task>_>_>
             ._M_impl.super__Deque_impl_data._M_start._M_first;
    psVar6 = (this->tasks).
             super__Deque_base<std::shared_ptr<hwnet::Task>,_std::allocator<std::shared_ptr<hwnet::Task>_>_>
             ._M_impl.super__Deque_impl_data._M_start._M_last;
    ppsVar1 = (this->tasks).
              super__Deque_base<std::shared_ptr<hwnet::Task>,_std::allocator<std::shared_ptr<hwnet::Task>_>_>
              ._M_impl.super__Deque_impl_data._M_start._M_node;
    psVar7 = (this->tasks).
             super__Deque_base<std::shared_ptr<hwnet::Task>,_std::allocator<std::shared_ptr<hwnet::Task>_>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_first;
    psVar8 = (this->tasks).
             super__Deque_base<std::shared_ptr<hwnet::Task>,_std::allocator<std::shared_ptr<hwnet::Task>_>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_last;
    ppsVar2 = (this->tasks).
              super__Deque_base<std::shared_ptr<hwnet::Task>,_std::allocator<std::shared_ptr<hwnet::Task>_>_>
              ._M_impl.super__Deque_impl_data._M_finish._M_node;
    (this->tasks).
    super__Deque_base<std::shared_ptr<hwnet::Task>,_std::allocator<std::shared_ptr<hwnet::Task>_>_>.
    _M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
    (this->tasks).
    super__Deque_base<std::shared_ptr<hwnet::Task>,_std::allocator<std::shared_ptr<hwnet::Task>_>_>.
    _M_impl.super__Deque_impl_data._M_map_size = 0;
    (this->tasks).
    super__Deque_base<std::shared_ptr<hwnet::Task>,_std::allocator<std::shared_ptr<hwnet::Task>_>_>.
    _M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
    (this->tasks).
    super__Deque_base<std::shared_ptr<hwnet::Task>,_std::allocator<std::shared_ptr<hwnet::Task>_>_>.
    _M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
    (this->tasks).
    super__Deque_base<std::shared_ptr<hwnet::Task>,_std::allocator<std::shared_ptr<hwnet::Task>_>_>.
    _M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
    (this->tasks).
    super__Deque_base<std::shared_ptr<hwnet::Task>,_std::allocator<std::shared_ptr<hwnet::Task>_>_>.
    _M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
    (this->tasks).
    super__Deque_base<std::shared_ptr<hwnet::Task>,_std::allocator<std::shared_ptr<hwnet::Task>_>_>.
    _M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
    (this->tasks).
    super__Deque_base<std::shared_ptr<hwnet::Task>,_std::allocator<std::shared_ptr<hwnet::Task>_>_>.
    _M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
    (this->tasks).
    super__Deque_base<std::shared_ptr<hwnet::Task>,_std::allocator<std::shared_ptr<hwnet::Task>_>_>.
    _M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
    (this->tasks).
    super__Deque_base<std::shared_ptr<hwnet::Task>,_std::allocator<std::shared_ptr<hwnet::Task>_>_>.
    _M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
    ptVar13 = out;
    ptVar14 = &this->tasks;
    for (lVar11 = 10; lVar11 != 0; lVar11 = lVar11 + -1) {
      (ptVar14->
      super__Deque_base<std::shared_ptr<hwnet::Task>,_std::allocator<std::shared_ptr<hwnet::Task>_>_>
      )._M_impl.super__Deque_impl_data._M_map =
           (ptVar13->
           super__Deque_base<std::shared_ptr<hwnet::Task>,_std::allocator<std::shared_ptr<hwnet::Task>_>_>
           )._M_impl.super__Deque_impl_data._M_map;
      ptVar13 = (taskque *)((long)ptVar13 + ((ulong)bVar16 * -2 + 1) * 8);
      ptVar14 = (taskque *)((long)ptVar14 + (ulong)bVar16 * -0x10 + 8);
    }
    (out->
    super__Deque_base<std::shared_ptr<hwnet::Task>,_std::allocator<std::shared_ptr<hwnet::Task>_>_>)
    ._M_impl.super__Deque_impl_data._M_map = ppsVar3;
    (out->
    super__Deque_base<std::shared_ptr<hwnet::Task>,_std::allocator<std::shared_ptr<hwnet::Task>_>_>)
    ._M_impl.super__Deque_impl_data._M_map_size = sVar4;
    (out->
    super__Deque_base<std::shared_ptr<hwnet::Task>,_std::allocator<std::shared_ptr<hwnet::Task>_>_>)
    ._M_impl.super__Deque_impl_data._M_start._M_cur = psVar12;
    (out->
    super__Deque_base<std::shared_ptr<hwnet::Task>,_std::allocator<std::shared_ptr<hwnet::Task>_>_>)
    ._M_impl.super__Deque_impl_data._M_start._M_first = psVar5;
    (out->
    super__Deque_base<std::shared_ptr<hwnet::Task>,_std::allocator<std::shared_ptr<hwnet::Task>_>_>)
    ._M_impl.super__Deque_impl_data._M_start._M_last = psVar6;
    (out->
    super__Deque_base<std::shared_ptr<hwnet::Task>,_std::allocator<std::shared_ptr<hwnet::Task>_>_>)
    ._M_impl.super__Deque_impl_data._M_start._M_node = ppsVar1;
    (out->
    super__Deque_base<std::shared_ptr<hwnet::Task>,_std::allocator<std::shared_ptr<hwnet::Task>_>_>)
    ._M_impl.super__Deque_impl_data._M_finish._M_cur = psVar10;
    (out->
    super__Deque_base<std::shared_ptr<hwnet::Task>,_std::allocator<std::shared_ptr<hwnet::Task>_>_>)
    ._M_impl.super__Deque_impl_data._M_finish._M_first = psVar7;
    (out->
    super__Deque_base<std::shared_ptr<hwnet::Task>,_std::allocator<std::shared_ptr<hwnet::Task>_>_>)
    ._M_impl.super__Deque_impl_data._M_finish._M_last = psVar8;
    (out->
    super__Deque_base<std::shared_ptr<hwnet::Task>,_std::allocator<std::shared_ptr<hwnet::Task>_>_>)
    ._M_impl.super__Deque_impl_data._M_finish._M_node = ppsVar2;
    bVar15 = true;
  }
  pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  return bVar15;
}

Assistant:

bool ThreadPool::TaskQueue::Get(ThreadPool::TaskQueue::taskque &out) {
	std::lock_guard<std::mutex> guard(this->mtx);
	for( ; ;) {
		if(this->closed) {
			if(this->tasks.empty()) {
				return false;
			} else {
				this->tasks.swap(out);
				return true;
			}
		} else {
			if(this->tasks.empty()) {
				++this->watting;//增加等待数量
				this->cv.wait(this->mtx);
				--this->watting;//减少正在等待的线程数量
			} else {
				this->tasks.swap(out);
				return true;
			}	
		}
	}
}